

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall
ON_SerialNumberMap::Internal_HashTableFindId
          (ON_SerialNumberMap *this,ON_UUID id,ON__UINT32 id_crc32,bool bBuildTableIfNeeded)

{
  SN_ELEMENT *pSVar1;
  bool bVar2;
  SN_ELEMENT *local_48;
  SN_ELEMENT *e_1;
  SN_ELEMENT *e;
  ON__UINT32 i;
  bool bBuildTableIfNeeded_local;
  ON__UINT32 id_crc32_local;
  ON_SerialNumberMap *this_local;
  ON_UUID id_local;
  
  id_local._0_8_ = id.Data4;
  this_local = id._0_8_;
  if (this->m_bHashTableIsValid == '\0') {
    e._4_4_ = 0;
    while( true ) {
      bVar2 = false;
      if (e._4_4_ < 8) {
        bVar2 = e._4_4_ < this->m_sn_block0->m_count;
      }
      if (!bVar2) break;
      bVar2 = IdIsEqual((ON_UUID *)&this_local,&this->m_sn_block0->m_sn[e._4_4_].m_id);
      if ((bVar2) && (pSVar1 = this->m_sn_block0->m_sn + e._4_4_, pSVar1->m_id_active != '\0')) {
        return pSVar1;
      }
      e._4_4_ = e._4_4_ + 1;
    }
    if (!bBuildTableIfNeeded) {
      return (SN_ELEMENT *)0x0;
    }
    Internal_HashTableBuild(this);
    if (this->m_bHashTableIsValid == '\0') {
      return (SN_ELEMENT *)0x0;
    }
  }
  local_48 = this->m_hash_table_blocks[(ulong)id_crc32 % (ulong)this->m_hash_block_count]
             [((ulong)id_crc32 / 0xffa) % 0xffa];
  while( true ) {
    if (local_48 == (SN_ELEMENT *)0x0) {
      return (SN_ELEMENT *)0x0;
    }
    bVar2 = IdIsEqual((ON_UUID *)&this_local,&local_48->m_id);
    if (bVar2) break;
    local_48 = local_48->m_next;
  }
  return local_48;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::Internal_HashTableFindId(
  ON_UUID id,
  ON__UINT32 id_crc32,
  bool bBuildTableIfNeeded
  ) const
{
  // Caller checks that m_active_id_count > 0 && id != nil && id != m_inactive_id

  if (false == m_bHashTableIsValid)
  {
    for (ON__UINT32 i = 0; i < 8 && i < m_sn_block0.m_count; i++)
    {
      if ( IdIsEqual(&id,&m_sn_block0.m_sn[i].m_id) )
      {
        ON_SerialNumberMap::SN_ELEMENT* e = const_cast<ON_SerialNumberMap::SN_ELEMENT*>(&m_sn_block0.m_sn[i]);
        if ( 0 != e->m_id_active )
          return e;
      }
    }
    if ( false == bBuildTableIfNeeded )
      return nullptr;

    // expensive
    Internal_HashTableBuild();
    if ( false == m_bHashTableIsValid )
      return nullptr;
  }

  for (
    ON_SerialNumberMap::SN_ELEMENT* e = m_hash_table_blocks[id_crc32 % m_hash_block_count][(id_crc32 / ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY) % ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY];
    nullptr != e;
    e = e->m_next
    )
  {
    if ( IdIsEqual(&id,&e->m_id) )
      return e;
  }

  return nullptr;
}